

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reverse.cpp
# Opt level: O3

void reverse(void)

{
  uint8_t *puVar1;
  void *pvVar2;
  undefined8 uVar3;
  uint16_t uVar4;
  pointer paVar5;
  pointer paVar6;
  ulong uVar7;
  bool bVar8;
  int iVar9;
  Rgba RVar10;
  uint uVar11;
  undefined8 uVar12;
  ulong uVar13;
  undefined4 extraout_var;
  __visit_result_t<Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:62:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:63:29)>,_std::variant<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>_&>
  pbVar14;
  long lVar15;
  undefined4 extraout_var_00;
  ulong uVar16;
  int *piVar17;
  char *pcVar18;
  byte bVar19;
  ulong uVar20;
  ulong uVar21;
  byte bVar22;
  char cVar23;
  iterator __begin2;
  long lVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  array<unsigned_char,_16UL> *paVar29;
  uint8_t y;
  long lVar30;
  byte bVar31;
  Rgba *__first1;
  uchar *attr;
  Rgba *__first2;
  ulong uVar32;
  initializer_list<std::array<Rgba,_4UL>_> __l;
  vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_> local_308;
  png_structp png;
  ulong local_2e8;
  png_infop pngInfo;
  optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  attrmap;
  optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  tilemap;
  uint8_t *rowPtrs [8];
  optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  palmap;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tileRow;
  DefaultInitVec<uint8_t> tiles;
  Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:77:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:83:29)>
  local_1d8;
  png_color_8 sbitChunk;
  path local_1c8;
  path local_1a0;
  path local_178;
  File pngFile;
  path local_58;
  
  uVar12 = png_get_libpng_ver(0);
  Options::verbosePrint(&options,'\x01',"Using libpng %s\n",uVar12);
  if (options.output.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload.
      super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
      super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged == false) {
    fatal("Tile data must be provided when reversing an image!");
  }
  if ((options.allowDedup == true) &&
     (options.tilemap.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload.
      super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
      super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged == false)) {
    warning("Tile deduplication is enabled, but no tilemap is provided?");
  }
  if (options.useColorCurve == true) {
    warning("The color curve is not yet supported in reverse mode...");
  }
  if (((options.inputSlice.left != 0) || (options.inputSlice.top != 0)) ||
     (options.inputSlice.height != 0)) {
    warning("\"Sliced-off\" pixels are ignored in reverse mode");
  }
  if ((options.inputSlice.width != 0) &&
     ((uint)options.reversedWidth * 8 != (uint)options.inputSlice.width)) {
    warning("Specified input slice width (%u) doesn\'t match provided reversing width (%u * 8)");
  }
  Options::verbosePrint(&options,'\x02',"Reading tiles...\n");
  std::filesystem::__cxx11::path::path(&local_58,(path *)&options.output);
  readInto(&tiles,&local_58);
  std::filesystem::__cxx11::path::~path(&local_58);
  uVar27 = (long)tiles.
                 super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)tiles.
                 super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  uVar20 = (ulong)(byte)(options.bitDepth << 3);
  if (uVar27 % uVar20 != 0) {
    fatal("Tile data size (%zu bytes) is not a multiple of %u bytes",uVar27,uVar20);
  }
  uVar27 = uVar27 / uVar20 + options.trim;
  Options::verbosePrint(&options,'\x03',"Read %zu tiles.\n",uVar27);
  tilemap.
  super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_engaged = false;
  if (options.tilemap.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload.
      super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
      super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged == true) {
    std::filesystem::__cxx11::path::path(&local_178,(path *)&options.tilemap);
    readInto((DefaultInitVec<uint8_t> *)&pngFile,&local_178);
    std::
    optional<std::vector<unsigned_char,default_init_allocator<unsigned_char,std::allocator<unsigned_char>>>>
    ::operator=((optional<std::vector<unsigned_char,default_init_allocator<unsigned_char,std::allocator<unsigned_char>>>>
                 *)&tilemap,
                (vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)&pngFile);
    pvVar2 = (void *)CONCAT44(pngFile._file.
                              super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                              .
                              super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              .
                              super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              .
                              super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              .
                              super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              .
                              super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              ._M_u._4_4_,
                              pngFile._file.
                              super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                              .
                              super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              .
                              super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              .
                              super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              .
                              super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              .
                              super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              ._M_u._0_4_);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,pngFile._file.
                             super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                             .
                             super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                             .
                             super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                             .
                             super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                             .
                             super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                             .
                             super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                             ._M_u._16_8_ - (long)pvVar2);
    }
    std::filesystem::__cxx11::path::~path(&local_178);
    uVar27 = (long)tilemap.
                   super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ._M_payload._M_value.
                   super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             tilemap.
             super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_payload._0_8_;
    Options::verbosePrint(&options,'\x03',"Read %zu tilemap entries.\n",uVar27);
  }
  if (uVar27 == 0) {
    fatal("Cannot generate empty image");
  }
  if ((ulong)options.maxNbTiles._M_elems[1] + (ulong)options.maxNbTiles._M_elems[0] < uVar27) {
    warning("Read %zu tiles, more than the limit of %zu + %zu",uVar27);
  }
  uVar32 = (ulong)options.reversedWidth;
  uVar13 = uVar27 / uVar32;
  if (uVar27 % uVar32 != 0) {
    fatal("Total number of tiles read (%zu) cannot be divided by image width (%zu tiles)",uVar27,
          uVar32);
  }
  Options::verbosePrint(&options,'\x03',"Reversed image dimensions: %zux%zu tiles\n",uVar32,uVar13);
  pngFile._file.
  super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
  .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_u._0_4_ =
       0xffffffff;
  pngFile._file.
  super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
  .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_u._4_4_ =
       0xffaaaaaa;
  pngFile._file.
  super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
  .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_u._8_4_ =
       0xff555555;
  pngFile._file.
  super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
  .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_u._12_4_
       = 0xff000000;
  __l._M_len = 1;
  __l._M_array = (iterator)&pngFile;
  std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::vector
            (&local_308,__l,(allocator_type *)rowPtrs);
  paVar6 = local_308.
           super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  paVar5 = local_308.
           super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_2e8 = uVar27;
  if (options.palettes.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload
      .super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
      super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged == true) {
    pngFile._file.
    super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
    .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_u._0_4_
         = 0;
    pngFile._file.
    super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
    .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_u._4_4_
         = 0;
    pngFile._file.
    super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
    .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_index =
         '\0';
    iVar9 = File::open(&pngFile,(char *)&options.palettes,0xc);
    if (CONCAT44(extraout_var,iVar9) == 0) {
      attrmap.
      super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_payload._M_value.
      super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)&options.palettes;
      std::
      visit_abi_cxx11_<Visitor<File::string(std::filesystem::__cxx11::path_const&)const::_lambda(std::filebuf_const&)_1_,File::string[abi:cxx11](std::filesystem::__cxx11::path_const&)const::_lambda(std::streambuf_const*)_1_>,std::variant<std::streambuf*,std::filebuf>const&>
                ((__visit_result_t<Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:90:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:91:29)>,_const_std::variant<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>_&>
                  *)rowPtrs,
                 (Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:90:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:91:29)>
                  *)&attrmap,&pngFile._file);
      piVar17 = __errno_location();
      pcVar18 = strerror(*piVar17);
      fatal("Failed to open \"%s\": %s",rowPtrs[0],pcVar18);
    }
    if (local_308.super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_308.super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      local_308.super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_308.
           super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
    }
    while( true ) {
      pbVar14 = std::operator*((Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:62:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:63:29)>
                                *)&attrmap,&pngFile._file);
      lVar15 = (**(code **)(*(long *)pbVar14 + 0x40))(pbVar14,rowPtrs,8);
      if (lVar15 != 8) break;
      if (local_308.
          super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl
          .super__Vector_impl_data._M_finish ==
          local_308.
          super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::
        _M_realloc_insert<>(&local_308,
                            (iterator)
                            local_308.
                            super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
      }
      else {
        (local_308.
         super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
         super__Vector_impl_data._M_finish)->_M_elems[0].red = '\0';
        (local_308.
         super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
         super__Vector_impl_data._M_finish)->_M_elems[0].green = '\0';
        (local_308.
         super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
         super__Vector_impl_data._M_finish)->_M_elems[0].blue = '\0';
        (local_308.
         super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
         super__Vector_impl_data._M_finish)->_M_elems[0].alpha = '\0';
        (local_308.
         super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
         super__Vector_impl_data._M_finish)->_M_elems[1].red = '\0';
        (local_308.
         super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
         super__Vector_impl_data._M_finish)->_M_elems[1].green = '\0';
        (local_308.
         super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
         super__Vector_impl_data._M_finish)->_M_elems[1].blue = '\0';
        (local_308.
         super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
         super__Vector_impl_data._M_finish)->_M_elems[1].alpha = '\0';
        (local_308.
         super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
         super__Vector_impl_data._M_finish)->_M_elems[2].red = '\0';
        (local_308.
         super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
         super__Vector_impl_data._M_finish)->_M_elems[2].green = '\0';
        (local_308.
         super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
         super__Vector_impl_data._M_finish)->_M_elems[2].blue = '\0';
        (local_308.
         super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
         super__Vector_impl_data._M_finish)->_M_elems[2].alpha = '\0';
        (local_308.
         super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
         super__Vector_impl_data._M_finish)->_M_elems[3].red = '\0';
        (local_308.
         super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
         super__Vector_impl_data._M_finish)->_M_elems[3].green = '\0';
        (local_308.
         super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
         super__Vector_impl_data._M_finish)->_M_elems[3].blue = '\0';
        (local_308.
         super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
         super__Vector_impl_data._M_finish)->_M_elems[3].alpha = '\0';
        local_308.super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_308.
             super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      paVar5 = local_308.
               super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (options.nbColorsPerPal != '\0') {
        uVar27 = (ulong)options.nbColorsPerPal;
        lVar24 = 0;
        lVar15 = (long)rowPtrs + 1;
        do {
          RVar10 = Rgba::fromCGBColor(*(uint16_t *)(lVar15 + -1));
          *(Rgba *)(&((Rgba *)&((Rgba *)((long)paVar5 + -0x10))->red)->red + lVar24) = RVar10;
          lVar15 = lVar15 + 2;
          lVar24 = lVar24 + 4;
        } while (uVar27 * 4 != lVar24);
      }
    }
    if (lVar15 != 0) {
      fatal("Palette data size (%zu) is not a multiple of %zu bytes!\n",
            ((long)local_308.
                   super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_308.
                   super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 1) + lVar15,8);
    }
    if ((ulong)options.nbPalettes <
        (ulong)((long)local_308.
                      super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_308.
                      super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4)) {
      warning("Read %zu palettes, more than the specified limit of %zu");
    }
    paVar5 = local_308.
             super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (options.palSpecType == EXPLICIT) {
      __first1 = (local_308.
                  super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_elems;
      __first2 = (options.palSpec.
                  super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_elems;
      if ((long)local_308.
                super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_308.
                super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
                _M_impl.super__Vector_impl_data._M_start ==
          (long)options.palSpec.
                super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)options.palSpec.
                super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
                _M_impl.super__Vector_impl_data._M_start) {
        while (__first1 != paVar5->_M_elems) {
          bVar8 = std::__equal<false>::equal<Rgba_const*,Rgba_const*>
                            (__first1,__first1 + 4,__first2);
          if (!bVar8) goto LAB_001129d1;
          __first2 = __first2 + 4;
          __first1 = __first1 + 4;
        }
      }
      else {
LAB_001129d1:
        warning("Colors in the palette file do not match those specified with `-c`!");
      }
    }
    File::~File(&pngFile);
  }
  else if (options.palSpecType == EXPLICIT) {
    local_308.super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
    _M_impl.super__Vector_impl_data._M_start =
         options.palSpec.
         super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_308.super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         options.palSpec.
         super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_308.super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         options.palSpec.
         super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    options.palSpec.
    super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    options.palSpec.
    super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    options.palSpec.
    super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (paVar5->_M_elems != (Rgba *)0x0) {
      operator_delete(paVar5,(long)paVar6 - (long)paVar5);
    }
  }
  else if (options.palSpecType == EMBEDDED) {
    warning(
           "An embedded palette was requested, but no palette file was specified; ignoring request."
           );
  }
  attrmap.
  super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_engaged = false;
  if (options.attrmap.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload.
      super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
      super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged == true) {
    std::filesystem::__cxx11::path::path(&local_1a0,(path *)&options.attrmap);
    readInto((DefaultInitVec<uint8_t> *)&pngFile,&local_1a0);
    std::
    optional<std::vector<unsigned_char,default_init_allocator<unsigned_char,std::allocator<unsigned_char>>>>
    ::operator=((optional<std::vector<unsigned_char,default_init_allocator<unsigned_char,std::allocator<unsigned_char>>>>
                 *)&attrmap,
                (vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)&pngFile);
    pvVar2 = (void *)CONCAT44(pngFile._file.
                              super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                              .
                              super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              .
                              super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              .
                              super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              .
                              super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              .
                              super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              ._M_u._4_4_,
                              pngFile._file.
                              super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                              .
                              super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              .
                              super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              .
                              super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              .
                              super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              .
                              super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              ._M_u._0_4_);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,pngFile._file.
                             super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                             .
                             super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                             .
                             super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                             .
                             super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                             .
                             super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                             .
                             super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                             ._M_u._16_8_ - (long)pvVar2);
    }
    std::filesystem::__cxx11::path::~path(&local_1a0);
    if ((long)attrmap.
              super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_payload._M_value.
              super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        attrmap.
        super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_payload._0_8_ != local_2e8) {
      fatal("Attribute map size (%zu tiles) doesn\'t match image\'s (%zu)",
            (long)attrmap.
                  super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_payload._M_value.
                  super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            attrmap.
            super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_payload._0_8_,local_2e8);
    }
    if (attrmap.
        super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_payload._M_value.
        super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        attrmap.
        super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_payload._M_value.
        super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      bVar8 = false;
      uVar12 = attrmap.
               super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_payload._M_value.
               super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        bVar22 = *(byte *)uVar12;
        if ((ulong)((long)local_308.
                          super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_308.
                          super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4) < (ulong)(bVar22 & 7)) {
          bVar8 = true;
          error("Referencing palette %u, but there are only %zu!");
        }
        if (((bVar22 & 8) != 0) &&
           (tilemap.
            super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_engaged == false)) {
          warning("Tile in bank 1 but no tilemap specified; ignoring the bank bit");
        }
        uVar12 = uVar12 + 1;
      } while ((pointer)uVar12 !=
               attrmap.
               super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_payload._M_value.
               super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
      if (bVar8) {
        giveUp();
      }
    }
  }
  if (tilemap.
      super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_engaged == true) {
    uVar12 = tilemap.
             super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_payload._M_value.
             super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = attrmap.
            super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_payload._M_value.
            super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    if (attrmap.
        super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_engaged == true) {
      for (; (pointer)uVar12 !=
             tilemap.
             super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_payload._M_value.
             super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_finish; uVar12 = (byte *)(uVar12 + 1)) {
        uVar11 = *(byte *)uVar3 >> 3 & 1;
        if (options.maxNbTiles._M_elems[uVar11] <= (ushort)*(byte *)uVar12) {
          warning("Tile #%u was referenced, but the limit for bank %u is %u",(ulong)*(byte *)uVar12,
                  (ulong)(byte)uVar11);
        }
        uVar3 = (byte *)(uVar3 + 1);
      }
    }
    else {
      for (; (pointer)uVar12 !=
             tilemap.
             super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_payload._M_value.
             super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_finish; uVar12 = (byte *)(uVar12 + 1)) {
        if (options.maxNbTiles._M_elems[0] <= *(byte *)uVar12) {
          warning("Tile #%u was referenced, but the limit is %u",(ulong)*(byte *)uVar12);
        }
      }
    }
  }
  uVar27 = local_2e8;
  palmap.
  super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_engaged = false;
  if (options.palmap.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload.
      super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
      super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged == true) {
    std::filesystem::__cxx11::path::path(&local_1c8,(path *)&options.palmap);
    readInto((DefaultInitVec<uint8_t> *)&pngFile,&local_1c8);
    std::
    optional<std::vector<unsigned_char,default_init_allocator<unsigned_char,std::allocator<unsigned_char>>>>
    ::operator=((optional<std::vector<unsigned_char,default_init_allocator<unsigned_char,std::allocator<unsigned_char>>>>
                 *)&palmap,
                (vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)&pngFile);
    pvVar2 = (void *)CONCAT44(pngFile._file.
                              super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                              .
                              super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              .
                              super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              .
                              super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              .
                              super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              .
                              super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              ._M_u._4_4_,
                              pngFile._file.
                              super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                              .
                              super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              .
                              super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              .
                              super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              .
                              super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              .
                              super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                              ._M_u._0_4_);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,pngFile._file.
                             super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                             .
                             super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                             .
                             super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                             .
                             super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                             .
                             super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                             .
                             super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                             ._M_u._16_8_ - (long)pvVar2);
    }
    std::filesystem::__cxx11::path::~path(&local_1c8);
    if ((long)palmap.
              super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_payload._M_value.
              super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        palmap.
        super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_payload._0_8_ != uVar27) {
      fatal("Palette map size (%zu tiles) doesn\'t match image\'s (%zu)",
            (long)palmap.
                  super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_payload._M_value.
                  super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            palmap.
            super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_payload._0_8_,uVar27);
    }
  }
  Options::verbosePrint(&options,'\x02',"Writing image...\n");
  pngFile._file.
  super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
  .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_u._0_4_ =
       0;
  pngFile._file.
  super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
  .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_u._4_4_ =
       0;
  pngFile._file.
  super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
  .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_index =
       '\0';
  iVar9 = File::open(&pngFile,(char *)&options.input,0x14);
  if (CONCAT44(extraout_var_00,iVar9) == 0) {
    tileRow.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&options.input;
    std::
    visit_abi_cxx11_<Visitor<File::string(std::filesystem::__cxx11::path_const&)const::_lambda(std::filebuf_const&)_1_,File::string[abi:cxx11](std::filesystem::__cxx11::path_const&)const::_lambda(std::streambuf_const*)_1_>,std::variant<std::streambuf*,std::filebuf>const&>
              ((__visit_result_t<Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:90:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:91:29)>,_const_std::variant<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>_&>
                *)rowPtrs,
               (Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:90:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:91:29)>
                *)&tileRow,&pngFile._file);
    piVar17 = __errno_location();
    pcVar18 = strerror(*piVar17);
    fatal("Failed to create \"%s\": %s",rowPtrs[0],pcVar18);
  }
  tileRow.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&options.input;
  std::
  visit_abi_cxx11_<Visitor<File::string(std::filesystem::__cxx11::path_const&)const::_lambda(std::filebuf_const&)_1_,File::string[abi:cxx11](std::filesystem::__cxx11::path_const&)const::_lambda(std::streambuf_const*)_1_>,std::variant<std::streambuf*,std::filebuf>const&>
            ((__visit_result_t<Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:90:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:91:29)>,_const_std::variant<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>_&>
              *)rowPtrs,
             (Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:90:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:91:29)>
              *)&tileRow,&pngFile._file);
  png = (png_structp)png_create_write_struct("1.6.37",rowPtrs[0],pngError,pngWarning);
  if ((uint8_t **)rowPtrs[0] != rowPtrs + 2) {
    operator_delete(rowPtrs[0],(ulong)(rowPtrs[2] + 1));
  }
  if (png == (png_structp)0x0) {
    piVar17 = __errno_location();
    pcVar18 = strerror(*piVar17);
    fatal("Couldn\'t create PNG write struct: %s",pcVar18);
  }
  pngInfo = (png_infop)png_create_info_struct(png);
  if (pngInfo == (png_infop)0x0) {
    piVar17 = __errno_location();
    pcVar18 = strerror(*piVar17);
    fatal("Couldn\'t create PNG info struct: %s",pcVar18);
  }
  png_set_write_fn(png,&pngFile,writePng,flushPng);
  png_set_IHDR(png,pngInfo,(ulong)options.reversedWidth << 3,(int)uVar13 * 8,8,6,0,0,0);
  png_write_info(png,pngInfo);
  sbitChunk.red = '\x05';
  sbitChunk.green = '\x05';
  sbitChunk.blue = '\x05';
  sbitChunk.alpha = '\x01';
  png_set_sBIT(png,pngInfo);
  uVar4 = options.reversedWidth;
  uVar27 = (ulong)options.reversedWidth;
  rowPtrs[0] = (uint8_t *)CONCAT71(rowPtrs[0]._1_7_,0xff);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&tileRow,(ulong)options.reversedWidth << 8,(value_type_conflict *)rowPtrs,
             (allocator_type *)&local_1d8);
  rowPtrs[0] = tileRow.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
  rowPtrs[1] = tileRow.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + (ulong)uVar4 * 0x20;
  rowPtrs[2] = tileRow.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + (ulong)uVar4 * 0x40;
  rowPtrs[3] = tileRow.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + (uint)uVar4 * 0x60;
  rowPtrs[4] = tileRow.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + (ulong)uVar4 * 0x80;
  rowPtrs[5] = tileRow.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + (uint)uVar4 * 0xa0;
  rowPtrs[6] = tileRow.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + (uint)uVar4 * 0xc0;
  rowPtrs[7] = tileRow.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + uVar27 * 0xe0;
  if (uVar32 <= local_2e8) {
    uVar26 = 0;
    uVar27 = local_2e8;
    do {
      uVar7 = local_2e8;
      lVar15 = 0;
      lVar24 = 0;
      do {
        uVar16 = uVar26 * uVar32 + lVar24;
        if (options.columnMajor != false) {
          uVar16 = lVar24 * uVar32 + uVar26;
        }
        uVar28 = 0;
        if (attrmap.
            super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_engaged == true) {
          uVar28 = (ulong)attrmap.
                          super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          ._M_payload._M_value.
                          super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar16];
        }
        uVar21 = uVar16;
        if (tilemap.
            super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_engaged == true) {
          uVar11 = (uint)(uVar28 >> 3) & 1;
          uVar21 = (ulong)(int)(options.maxNbTiles._M_elems[0] * uVar11 +
                               ((uint)tilemap.
                                      super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                                      ._M_payload.
                                      super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                      ._M_payload._M_value.
                                      super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar16] -
                               (uint)options.baseTileIDs._M_elems[uVar11]));
        }
        if (uVar27 <= uVar21) {
          __assert_fail("tileID < nbTileInstances",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/reverse.cpp"
                        ,0x125,"reverse");
        }
        if (palmap.
            super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_engaged == true) {
          uVar11 = (uint)palmap.
                         super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                         ._M_payload.
                         super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ._M_payload._M_value.
                         super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar16];
        }
        else {
          uVar11 = (uint)uVar28 & 7;
        }
        if ((ulong)((long)local_308.
                          super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_308.
                          super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4) <= (ulong)uVar11) {
          __assert_fail("palID < palettes.size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/reverse.cpp"
                        ,0x127,"reverse");
        }
        paVar29 = (array<unsigned_char,_16UL> *)
                  (tiles.
                   super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar21 * uVar20);
        if (uVar27 - options.trim < uVar21) {
          paVar29 = &reverse::trimmedTile;
        }
        uVar11 = uVar11 << 4;
        lVar30 = 0;
        do {
          cVar23 = (char)lVar30;
          if ((uVar28 & 0x40) != 0) {
            cVar23 = '\a' - (char)lVar30;
          }
          bVar31 = paVar29->_M_elems[(byte)(options.bitDepth * cVar23)];
          bVar22 = paVar29->_M_elems
                   [(ulong)(options.bitDepth != '\x01') + (ulong)(byte)(options.bitDepth * cVar23)];
          if ((uVar28 & 0x20) != 0) {
            bVar31 = flipTable._M_elems[bVar31];
            bVar22 = flipTable._M_elems[bVar22];
          }
          puVar1 = rowPtrs[lVar30];
          lVar25 = 0;
          do {
            bVar19 = bVar22 >> 6 & 2 | bVar31 >> 7;
            puVar1[lVar25 * 4 + lVar15] =
                 (&((Rgba *)((long)local_308.
                                   super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + (ulong)bVar19 * 4))->
                   red)[uVar11];
            puVar1[lVar25 * 4 + lVar15 + 1] =
                 (&((Rgba *)((long)local_308.
                                   super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + (ulong)bVar19 * 4))->
                   green)[uVar11];
            puVar1[lVar25 * 4 + lVar15 + 2] =
                 (&((Rgba *)((long)local_308.
                                   super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + (ulong)bVar19 * 4))->
                   blue)[uVar11];
            puVar1[lVar25 * 4 + lVar15 + 3] =
                 (&((Rgba *)((long)local_308.
                                   super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + (ulong)bVar19 * 4))->
                   alpha)[uVar11];
            bVar31 = bVar31 * '\x02';
            bVar22 = bVar22 * '\x02';
            lVar25 = lVar25 + 1;
          } while ((char)lVar25 != '\b');
          lVar30 = lVar30 + 1;
        } while (lVar30 != 8);
        lVar24 = lVar24 + 1;
        lVar15 = lVar15 + 0x20;
        uVar27 = local_2e8;
      } while (lVar24 != uVar32 + (uVar32 == 0));
      png_write_rows(png,rowPtrs,8);
      uVar26 = uVar26 + 1;
      uVar27 = uVar7;
    } while (uVar26 < uVar13);
  }
  png_write_end(png,pngInfo);
  png_destroy_write_struct(&png,&pngInfo);
  local_1d8.super_anon_class_8_1_8991fb9c.this = (anon_class_8_1_8991fb9c)&pngFile;
  std::
  visit<Visitor<File::close()::_lambda(std::filebuf&)_1_,File::close()::_lambda(std::streambuf*)_1_>,std::variant<std::streambuf*,std::filebuf>&>
            (&local_1d8,
             (variant<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
              *)local_1d8.super_anon_class_8_1_8991fb9c.this);
  if (tileRow.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(tileRow.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)tileRow.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)tileRow.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  File::~File(&pngFile);
  if ((palmap.
       super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
       ._M_engaged == true) &&
     (palmap.
      super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_engaged = false,
     palmap.
     super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
     ._M_payload.
     super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
     .
     super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
     ._M_payload._M_value.
     super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
     ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(palmap.
                    super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ._M_payload._M_value.
                    super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)palmap.
                          super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          ._M_payload._M_value.
                          super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    palmap.
                    super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ._M_payload._0_8_);
  }
  if ((attrmap.
       super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
       ._M_engaged == true) &&
     (attrmap.
      super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_engaged = false,
     attrmap.
     super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
     ._M_payload.
     super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
     .
     super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
     ._M_payload._M_value.
     super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
     ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(attrmap.
                    super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ._M_payload._M_value.
                    super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)attrmap.
                          super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          ._M_payload._M_value.
                          super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    attrmap.
                    super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ._M_payload._0_8_);
  }
  if ((local_308.super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
       _M_impl.super__Vector_impl_data._M_start)->_M_elems != (Rgba *)0x0) {
    operator_delete(local_308.
                    super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_308.
                          super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_308.
                          super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((tilemap.
       super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
       ._M_engaged == true) &&
     (tilemap.
      super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_engaged = false,
     tilemap.
     super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
     ._M_payload.
     super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
     .
     super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
     ._M_payload._M_value.
     super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
     ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(tilemap.
                    super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ._M_payload._M_value.
                    super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)tilemap.
                          super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          ._M_payload._M_value.
                          super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    tilemap.
                    super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ._M_payload._0_8_);
  }
  if (tiles.
      super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(tiles.
                    super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)tiles.
                          super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)tiles.
                          super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void reverse() {
	options.verbosePrint(Options::VERB_CFG, "Using libpng %s\n", png_get_libpng_ver(nullptr));

	// Check for weird flag combinations

	if (!options.output.has_value()) {
		fatal("Tile data must be provided when reversing an image!");
	}

	if (options.allowDedup && !options.tilemap.has_value()) {
		warning("Tile deduplication is enabled, but no tilemap is provided?");
	}

	if (options.useColorCurve) {
		warning("The color curve is not yet supported in reverse mode...");
	}

	if (options.inputSlice.left != 0 || options.inputSlice.top != 0
	    || options.inputSlice.height != 0) {
		warning("\"Sliced-off\" pixels are ignored in reverse mode");
	}
	if (options.inputSlice.width != 0 && options.inputSlice.width != options.reversedWidth * 8) {
		warning("Specified input slice width (%" PRIu16
		        ") doesn't match provided reversing width (%" PRIu8 " * 8)",
		        options.inputSlice.width, options.reversedWidth);
	}

	options.verbosePrint(Options::VERB_LOG_ACT, "Reading tiles...\n");
	auto const tiles = readInto(*options.output);
	uint8_t tileSize = 8 * options.bitDepth;
	if (tiles.size() % tileSize != 0) {
		fatal("Tile data size (%zu bytes) is not a multiple of %" PRIu8 " bytes",
		      tiles.size(), tileSize);
	}

	// By default, assume tiles are not deduplicated, and add the (allegedly) trimmed tiles
	size_t nbTileInstances = tiles.size() / tileSize + options.trim; // Image size in tiles
	options.verbosePrint(Options::VERB_INTERM, "Read %zu tiles.\n", nbTileInstances);
	std::optional<DefaultInitVec<uint8_t>> tilemap;
	if (options.tilemap.has_value()) {
		tilemap = readInto(*options.tilemap);
		nbTileInstances = tilemap->size();
		options.verbosePrint(Options::VERB_INTERM, "Read %zu tilemap entries.\n", nbTileInstances);
	}

	if (nbTileInstances == 0) {
		fatal("Cannot generate empty image");
	}
	if (nbTileInstances > options.maxNbTiles[0] + options.maxNbTiles[1]) {
		warning("Read %zu tiles, more than the limit of %zu + %zu", nbTileInstances,
		        options.maxNbTiles[0], options.maxNbTiles[1]);
	}

	size_t width = options.reversedWidth, height; // In tiles
	if (nbTileInstances % width != 0) {
		fatal("Total number of tiles read (%zu) cannot be divided by image width (%zu tiles)",
		      nbTileInstances, width);
	}
	height = nbTileInstances / width;

	options.verbosePrint(Options::VERB_INTERM, "Reversed image dimensions: %zux%zu tiles\n", width,
	                     height);

	// TODO: -U

	std::vector<std::array<Rgba, 4>> palettes{
	    {Rgba(0xFFFFFFFF), Rgba(0xAAAAAAFF), Rgba(0x555555FF), Rgba(0x000000FF)}
	};
	// If a palette file is used as input, it overrides the default colours.
	if (options.palettes.has_value()) {
		File file;
		if (!file.open(*options.palettes, std::ios::in | std::ios::binary)) {
			fatal("Failed to open \"%s\": %s", file.string(*options.palettes).c_str(),
			      strerror(errno));
		}

		palettes.clear();
		std::array<uint8_t, sizeof(uint16_t) * 4> buf; // 4 colors
		size_t nbRead;
		do {
			nbRead = file->sgetn(reinterpret_cast<char *>(buf.data()), buf.size());
			if (nbRead == buf.size()) {
				// Expand the colors
				auto &palette = palettes.emplace_back();
				std::generate(palette.begin(), palette.begin() + options.nbColorsPerPal,
				              [&buf, i = 0]() mutable {
					              i += 2;
					              return Rgba::fromCGBColor(buf[i - 2] + (buf[i - 1] << 8));
				              });
			} else if (nbRead != 0) {
				fatal("Palette data size (%zu) is not a multiple of %zu bytes!\n",
				      palettes.size() * buf.size() + nbRead, buf.size());
			}
		} while (nbRead != 0);

		if (palettes.size() > options.nbPalettes) {
			warning("Read %zu palettes, more than the specified limit of %zu", palettes.size(),
			        options.nbPalettes);
		}

		if (options.palSpecType == Options::EXPLICIT && palettes != options.palSpec) {
			warning("Colors in the palette file do not match those specified with `-c`!");
		}
	} else if (options.palSpecType == Options::EMBEDDED) {
		warning("An embedded palette was requested, but no palette file was specified; ignoring request.");
	} else if (options.palSpecType == Options::EXPLICIT) {
		palettes = std::move(options.palSpec); // We won't be using it again.
	}

	std::optional<DefaultInitVec<uint8_t>> attrmap;
	if (options.attrmap.has_value()) {
		attrmap = readInto(*options.attrmap);
		if (attrmap->size() != nbTileInstances) {
			fatal("Attribute map size (%zu tiles) doesn't match image's (%zu)", attrmap->size(),
			      nbTileInstances);
		}

		// Scan through the attributes for inconsistencies
		// We do this now for two reasons:
		// 1. Checking those during the main loop is harmful to optimization, and
		// 2. It clutters the code more, and it's not in great shape to begin with
		bool bad = false;
		for (auto attr : *attrmap) {
			if ((attr & 0b111) > palettes.size()) {
				error("Referencing palette %u, but there are only %zu!");
				bad = true;
			}
			if (attr & 0x08 && !tilemap) {
				warning("Tile in bank 1 but no tilemap specified; ignoring the bank bit");
			}
		}
		if (bad) {
			giveUp();
		}
	}

	if (tilemap) {
		if (attrmap) {
			for (auto [id, attr] : zip(*tilemap, *attrmap)) {
				bool bank = attr & 1 << 3;
				if (id >= options.maxNbTiles[bank]) {
					warning("Tile #%" PRIu8
					        " was referenced, but the limit for bank %u is %" PRIu16,
					        id, bank, options.maxNbTiles[bank]);
				}
			}
		} else {
			for (auto id : *tilemap) {
				if (id >= options.maxNbTiles[0]) {
					warning("Tile #%" PRIu8 " was referenced, but the limit is %" PRIu16, id,
					        options.maxNbTiles[0]);
				}
			}
		}
	}

	std::optional<DefaultInitVec<uint8_t>> palmap;
	if (options.palmap.has_value()) {
		palmap = readInto(*options.palmap);
		if (palmap->size() != nbTileInstances) {
			fatal("Palette map size (%zu tiles) doesn't match image's (%zu)", palmap->size(),
			      nbTileInstances);
		}
	}

	options.verbosePrint(Options::VERB_LOG_ACT, "Writing image...\n");
	File pngFile;
	if (!pngFile.open(*options.input, std::ios::out | std::ios::binary)) {
		fatal("Failed to create \"%s\": %s", pngFile.string(*options.input).c_str(),
		      strerror(errno));
	}
	png_structp png = png_create_write_struct(
	    PNG_LIBPNG_VER_STRING,
	    const_cast<png_voidp>(static_cast<void const *>(pngFile.string(*options.input).c_str())),
	    pngError, pngWarning);
	if (!png) {
		fatal("Couldn't create PNG write struct: %s", strerror(errno));
	}
	png_infop pngInfo = png_create_info_struct(png);
	if (!pngInfo) {
		fatal("Couldn't create PNG info struct: %s", strerror(errno));
	}
	png_set_write_fn(png, &pngFile, writePng, flushPng);

	png_set_IHDR(png, pngInfo, options.reversedWidth * 8, height * 8, 8, PNG_COLOR_TYPE_RGB_ALPHA,
	             PNG_INTERLACE_NONE, PNG_COMPRESSION_TYPE_DEFAULT, PNG_FILTER_TYPE_DEFAULT);
	png_write_info(png, pngInfo);

	png_color_8 sbitChunk;
	sbitChunk.red = 5;
	sbitChunk.green = 5;
	sbitChunk.blue = 5;
	sbitChunk.alpha = 1;
	png_set_sBIT(png, pngInfo, &sbitChunk);

	constexpr uint8_t SIZEOF_PIXEL = 4; // Each pixel is 4 bytes (RGBA @ 8 bits/component)
	size_t const SIZEOF_ROW = options.reversedWidth * 8 * SIZEOF_PIXEL;
	std::vector<uint8_t> tileRow(8 * SIZEOF_ROW, 0xFF); // Data for 8 rows of pixels
	uint8_t * const rowPtrs[8] = {
	    &tileRow.data()[0 * SIZEOF_ROW], &tileRow.data()[1 * SIZEOF_ROW],
	    &tileRow.data()[2 * SIZEOF_ROW], &tileRow.data()[3 * SIZEOF_ROW],
	    &tileRow.data()[4 * SIZEOF_ROW], &tileRow.data()[5 * SIZEOF_ROW],
	    &tileRow.data()[6 * SIZEOF_ROW], &tileRow.data()[7 * SIZEOF_ROW],
	};

	for (size_t ty = 0; ty < height; ++ty) {
		for (size_t tx = 0; tx < width; ++tx) {
			size_t index = options.columnMajor ? ty + tx * width : ty * width + tx;
			// By default, a tile is unflipped, in bank 0, and uses palette #0
			uint8_t attribute = attrmap.has_value() ? (*attrmap)[index] : 0x00;
			bool bank = attribute & 0x08;
			// Get the tile ID at this location
			size_t tileID = index;
			if (tilemap.has_value()) {
				tileID =
				    (*tilemap)[index] - options.baseTileIDs[bank] + bank * options.maxNbTiles[0];
			}
			assert(tileID < nbTileInstances); // Should have been checked earlier
			size_t palID = palmap ? (*palmap)[index] : attribute & 0b111;
			assert(palID < palettes.size()); // Should be ensured on data read

			// We do not have data for tiles trimmed with `-x`, so assume they are "blank"
			static std::array<uint8_t, 16> const trimmedTile{
			    0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
			    0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
			};
			uint8_t const *tileData = tileID > nbTileInstances - options.trim
			                              ? trimmedTile.data()
			                              : &tiles[tileID * tileSize];
			auto const &palette = palettes[palID];
			for (uint8_t y = 0; y < 8; ++y) {
				// If vertically mirrored, fetch the bytes from the other end
				uint8_t realY = (attribute & 0x40 ? 7 - y : y) * options.bitDepth;
				uint8_t bitplane0 = tileData[realY];
				uint8_t bitplane1 = tileData[realY + 1 % options.bitDepth];
				if (attribute & 0x20) { // Handle horizontal flip
					bitplane0 = flipTable[bitplane0];
					bitplane1 = flipTable[bitplane1];
				}
				uint8_t *ptr = &rowPtrs[y][tx * 8 * SIZEOF_PIXEL];
				for (uint8_t x = 0; x < 8; ++x) {
					uint8_t bit0 = bitplane0 & 0x80, bit1 = bitplane1 & 0x80;
					Rgba const &pixel = palette[bit0 >> 7 | bit1 >> 6];
					*ptr++ = pixel.red;
					*ptr++ = pixel.green;
					*ptr++ = pixel.blue;
					*ptr++ = pixel.alpha;

					// Shift the pixel out
					bitplane0 <<= 1;
					bitplane1 <<= 1;
				}
			}
		}
		// We never modify the pointers, and neither should libpng, despite the overly lax function
		// signature.
		// (AIUI, casting away const-ness is okay as long as you don't actually modify the
		// pointed-to data)
		png_write_rows(png, const_cast<png_bytepp>(rowPtrs), 8);
	}

	// Finalize the write
	png_write_end(png, pngInfo);

	png_destroy_write_struct(&png, &pngInfo);
	pngFile.close();
}